

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_ref.cpp
# Opt level: O3

bool __thiscall
ON_SubDComponentRef::GetBBox(ON_SubDComponentRef *this,double *boxmin,double *boxmax,bool bGrowBox)

{
  ON_SubDComponentPtr *this_00;
  Type TVar1;
  bool bVar2;
  ON_SubDVertex *this_01;
  ON_SubDEdge *this_02;
  ON_SubDFace *this_03;
  ON_BoundingBox bbox1;
  ON_BoundingBox local_88;
  ON_BoundingBox local_58;
  
  if (boxmax == (double *)0x0 || boxmin == (double *)0x0) {
    bVar2 = false;
  }
  else {
    local_88.m_max.y = ON_BoundingBox::EmptyBoundingBox.m_max.y;
    local_88.m_max.z = ON_BoundingBox::EmptyBoundingBox.m_max.z;
    local_88.m_min.z = ON_BoundingBox::EmptyBoundingBox.m_min.z;
    local_88.m_max.x = ON_BoundingBox::EmptyBoundingBox.m_max.x;
    local_88.m_min.x = ON_BoundingBox::EmptyBoundingBox.m_min.x;
    local_88.m_min.y = ON_BoundingBox::EmptyBoundingBox.m_min.y;
    this_00 = &this->m_component_ptr;
    TVar1 = ON_SubDComponentPtr::ComponentType(this_00);
    if (TVar1 == Face) {
      this_03 = ON_SubDComponentPtr::Face(this_00);
      if ((this_03 != (ON_SubDFace *)0x0) && ((byte)(this->m_component_location - ControlNet) < 2))
      {
        ON_SubDFace::ControlNetBoundingBox(&local_88,this_03);
      }
    }
    else if (TVar1 == Edge) {
      this_02 = ON_SubDComponentPtr::Edge(this_00);
      if ((this_02 != (ON_SubDEdge *)0x0) && ((byte)(this->m_component_location - ControlNet) < 2))
      {
        ON_SubDEdge::ControlNetBoundingBox(&local_88,this_02);
      }
    }
    else if (TVar1 == Vertex) {
      this_01 = ON_SubDComponentPtr::Vertex(this_00);
      if ((this_01 != (ON_SubDVertex *)0x0) && ((byte)(this->m_component_location - ControlNet) < 2)
         ) {
        ON_SubDVertex::ControlNetBoundingBox(&local_88,this_01);
      }
    }
    if (bGrowBox) {
      ON_BoundingBox::ON_BoundingBox(&local_58);
      ON_3dPoint::operator=(&local_58.m_min,boxmin);
      ON_3dPoint::operator=(&local_58.m_max,boxmax);
      bVar2 = ON_BoundingBox::IsValid(&local_58);
      if (bVar2) {
        ON_BoundingBox::Union(&local_88,&local_58);
      }
    }
    *boxmin = local_88.m_min.x;
    boxmin[1] = local_88.m_min.y;
    boxmin[2] = local_88.m_min.z;
    *boxmax = local_88.m_max.x;
    boxmax[1] = local_88.m_max.y;
    boxmax[2] = local_88.m_max.z;
    bVar2 = ON_BoundingBox::IsValid(&local_88);
  }
  return bVar2;
}

Assistant:

bool ON_SubDComponentRef::GetBBox(
  double* boxmin,
  double* boxmax,
  bool bGrowBox
  ) const
{
  if ( nullptr == boxmin || nullptr == boxmax )
    return false;

  ON_BoundingBox bbox = ON_BoundingBox::EmptyBoundingBox;

  switch (m_component_ptr.ComponentType())
  {
      case ON_SubDComponentPtr::Type::Unset:
        break;
      
      case ON_SubDComponentPtr::Type::Vertex:
    {
      const ON_SubDVertex* vertex = m_component_ptr.Vertex();
      if ( nullptr == vertex )
        break;
      switch (m_component_location)
      {
      case ON_SubDComponentLocation::Surface:
        // public opennurbs does not provide limit mesh tools.
      case ON_SubDComponentLocation::ControlNet:
        bbox = vertex->ControlNetBoundingBox();
        break;
              
      case ON_SubDComponentLocation::Unset:
        break;
      }
    }
    break;
  case ON_SubDComponentPtr::Type::Edge:
    {
      const ON_SubDEdge* edge = m_component_ptr.Edge();
      if ( nullptr == edge )
        break;
      switch (m_component_location)
      {
      case ON_SubDComponentLocation::Surface:
        // public opennurbs does not provide limit mesh tools.
      case ON_SubDComponentLocation::ControlNet:
        bbox = edge->ControlNetBoundingBox();
        break;
      case ON_SubDComponentLocation::Unset:
        break;
      }
    }
    break;
  case ON_SubDComponentPtr::Type::Face:
    {
      const ON_SubDFace* face = m_component_ptr.Face();
      if ( nullptr == face )
        break;
      switch (m_component_location)
      {
      case ON_SubDComponentLocation::Surface:
        // public opennurbs does not provide limit mesh tools.
      case ON_SubDComponentLocation::ControlNet:
        bbox = face->ControlNetBoundingBox();
        break;
      case ON_SubDComponentLocation::Unset:
        break;
      }
    }
    break;
  }

  if (bGrowBox)
  {
    ON_BoundingBox bbox1;
    bbox1.m_min = boxmin;
    bbox1.m_max = boxmax;
    if (bbox1.IsValid())
      bbox.Union(bbox1);
  }

  boxmin[0] = bbox.m_min.x;
  boxmin[1] = bbox.m_min.y;
  boxmin[2] = bbox.m_min.z;

  boxmax[0] = bbox.m_max.x;
  boxmax[1] = bbox.m_max.y;
  boxmax[2] = bbox.m_max.z;

  return bbox.IsValid();
}